

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sections.c
# Opt level: O1

void free_sections(void)

{
  section_s *psVar1;
  
  cur = root;
  if (root != (section_t *)0x0) {
    do {
      psVar1 = cur->next;
      free(cur);
      cur = psVar1;
    } while (psVar1 != (section_s *)0x0);
  }
  root = (section_t *)0x0;
  cur = (section_t *)0x0;
  return;
}

Assistant:

void free_sections()
{
    section_t* next = root;
    while (next)
    {
        cur = next;
        next = cur->next;
        free(cur);
    }
    root = NULL;
    cur = NULL;
}